

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall
OpenMD::SimpleTypeData<OpenMD::GBAtypeParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::GBAtypeParameters> *this)

{
  void *in_RDI;
  
  ~SimpleTypeData((SimpleTypeData<OpenMD::GBAtypeParameters> *)0x2be328);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

SimpleTypeData() : GenericData(), data_(ElemDataType()) {}